

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyExporter.cpp
# Opt level: O1

void __thiscall Assimp::PlyExporter::WriteMeshVerts(PlyExporter *this,aiMesh *m,uint components)

{
  float fVar1;
  ostream *poVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  bool bVar6;
  
  if (m->mNumVertices != 0) {
    uVar4 = 0;
    do {
      poVar2 = std::ostream::_M_insert<double>((double)m->mVertices[uVar4].x);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      poVar2 = std::ostream::_M_insert<double>((double)m->mVertices[uVar4].y);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      std::ostream::_M_insert<double>((double)m->mVertices[uVar4].z);
      if ((components & 1) != 0) {
        if ((m->mNormals != (aiVector3D *)0x0) && (m->mNumVertices != 0)) {
          fVar1 = m->mNormals[uVar4].x;
          if ((ABS(fVar1) != INFINITY) &&
             ((~(uint)fVar1 & 0x7f800000) != 0 || ((uint)fVar1 & 0x7fffff) == 0)) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," ",1);
            poVar2 = std::ostream::_M_insert<double>((double)m->mNormals[uVar4].x);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
            poVar2 = std::ostream::_M_insert<double>((double)m->mNormals[uVar4].y);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
            std::ostream::_M_insert<double>((double)m->mNormals[uVar4].z);
            goto LAB_006a57aa;
          }
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," 0.0 0.0 0.0",0xc);
      }
LAB_006a57aa:
      if ((components & 4) != 0) {
        uVar5 = 4;
        lVar3 = 0;
        do {
          if ((m->mTextureCoords[lVar3] == (aiVector3D *)0x0) || (m->mNumVertices == 0)) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," -1.0 -1.0",10);
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," ",1);
            poVar2 = std::ostream::_M_insert<double>((double)m->mTextureCoords[lVar3][uVar4].x);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
            std::ostream::_M_insert<double>((double)m->mTextureCoords[lVar3][uVar4].y);
          }
          uVar5 = uVar5 * 2;
        } while (((uVar5 & components) != 0) && (bVar6 = lVar3 != 7, lVar3 = lVar3 + 1, bVar6));
      }
      if ((components >> 10 & 1) != 0) {
        uVar5 = 0x400;
        lVar3 = 0;
        do {
          if ((m->mColors[lVar3] == (aiColor4D *)0x0) || (m->mNumVertices == 0)) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," 0 0 0",6);
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," ",1);
            poVar2 = (ostream *)
                     std::ostream::operator<<(this,(int)(m->mColors[lVar3][uVar4].r * 255.0));
            std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
            poVar2 = (ostream *)
                     std::ostream::operator<<(poVar2,(int)(m->mColors[lVar3][uVar4].g * 255.0));
            std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
            poVar2 = (ostream *)
                     std::ostream::operator<<(poVar2,(int)(m->mColors[lVar3][uVar4].b * 255.0));
            std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
            std::ostream::operator<<(poVar2,(int)(m->mColors[lVar3][uVar4].a * 255.0));
          }
          uVar5 = uVar5 * 2;
        } while (((components & uVar5) != 0) && (bVar6 = lVar3 != 7, lVar3 = lVar3 + 1, bVar6));
      }
      if ((components & 2) != 0) {
        if (((m->mTangents == (aiVector3D *)0x0) || (m->mBitangents == (aiVector3D *)0x0)) ||
           (m->mNumVertices == 0)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this," 0.0 0.0 0.0 0.0 0.0 0.0",0x18);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," ",1);
          poVar2 = std::ostream::_M_insert<double>((double)m->mTangents[uVar4].x);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
          poVar2 = std::ostream::_M_insert<double>((double)m->mTangents[uVar4].y);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
          poVar2 = std::ostream::_M_insert<double>((double)m->mTangents[uVar4].z);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
          poVar2 = std::ostream::_M_insert<double>((double)m->mBitangents[uVar4].x);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
          poVar2 = std::ostream::_M_insert<double>((double)m->mBitangents[uVar4].y);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
          std::ostream::_M_insert<double>((double)m->mBitangents[uVar4].z);
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
      uVar4 = uVar4 + 1;
    } while (uVar4 < m->mNumVertices);
  }
  return;
}

Assistant:

void PlyExporter::WriteMeshVerts(const aiMesh* m, unsigned int components)
{
    static const ai_real inf = std::numeric_limits<ai_real>::infinity();

    // If a component (for instance normal vectors) is present in at least one mesh in the scene,
    // then default values are written for meshes that do not contain this component.
    for (unsigned int i = 0; i < m->mNumVertices; ++i) {
        mOutput <<
            m->mVertices[i].x << " " <<
            m->mVertices[i].y << " " <<
            m->mVertices[i].z
        ;
        if(components & PLY_EXPORT_HAS_NORMALS) {
            if (m->HasNormals() && is_not_qnan(m->mNormals[i].x) && std::fabs(m->mNormals[i].x) != inf) {
                mOutput <<
                    " " << m->mNormals[i].x <<
                    " " << m->mNormals[i].y <<
                    " " << m->mNormals[i].z;
            }
            else {
                mOutput << " 0.0 0.0 0.0";
            }
        }

        for (unsigned int n = PLY_EXPORT_HAS_TEXCOORDS, c = 0; (components & n) && c != AI_MAX_NUMBER_OF_TEXTURECOORDS; n <<= 1, ++c) {
            if (m->HasTextureCoords(c)) {
                mOutput <<
                    " " << m->mTextureCoords[c][i].x <<
                    " " << m->mTextureCoords[c][i].y;
            }
            else {
                mOutput << " -1.0 -1.0";
            }
        }

        for (unsigned int n = PLY_EXPORT_HAS_COLORS, c = 0; (components & n) && c != AI_MAX_NUMBER_OF_COLOR_SETS; n <<= 1, ++c) {
            if (m->HasVertexColors(c)) {
                mOutput <<
                    " " << (int)(m->mColors[c][i].r * 255) <<
                    " " << (int)(m->mColors[c][i].g * 255) <<
                    " " << (int)(m->mColors[c][i].b * 255) <<
                    " " << (int)(m->mColors[c][i].a * 255);
            }
            else {
                mOutput << " 0 0 0";
            }
        }

        if(components & PLY_EXPORT_HAS_TANGENTS_BITANGENTS) {
            if (m->HasTangentsAndBitangents()) {
                mOutput <<
                " " << m->mTangents[i].x <<
                " " << m->mTangents[i].y <<
                " " << m->mTangents[i].z <<
                " " << m->mBitangents[i].x <<
                " " << m->mBitangents[i].y <<
                " " << m->mBitangents[i].z
                ;
            }
            else {
                mOutput << " 0.0 0.0 0.0 0.0 0.0 0.0";
            }
        }

        mOutput << endl;
    }
}